

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-tests.cpp
# Opt level: O2

void AllocateAllAndThenRelease(bool *result)

{
  undefined8 *puVar1;
  InheritedClass *pIVar2;
  ClassWithMemAllocations *pCVar3;
  LibClass *pLVar4;
  ComplexClass *pCVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  long lVar8;
  uint64_t memLeakSize;
  size_t sStack_75348;
  size_t memLeakCount;
  ComplexClass *complexClassArr [10000];
  LibClass *libClassArr [10000];
  ClassWithMemAllocations *classWithMemAllocationsArr [10000];
  InheritedClass *inheritedClassArr [10000];
  SimpleClass *simpleClassArr [10000];
  SimpleStruct *simpleStructArr [10000];
  
  __start(false,"",false);
  sStack_75348 = LibClass::getSizeOfInternalClass();
  for (lVar8 = 0; lVar8 != 80000; lVar8 = lVar8 + 8) {
    puVar1 = (undefined8 *)operator_new(8);
    *puVar1 = 0;
    *(undefined8 **)((long)simpleStructArr + lVar8) = puVar1;
    puVar1 = (undefined8 *)operator_new(8);
    *puVar1 = 0x3ff199999999999a;
    *(undefined8 **)((long)simpleClassArr + lVar8) = puVar1;
    pIVar2 = (InheritedClass *)operator_new(0x10);
    InheritedClass::InheritedClass(pIVar2);
    *(InheritedClass **)((long)inheritedClassArr + lVar8) = pIVar2;
    pCVar3 = (ClassWithMemAllocations *)operator_new(0x18);
    ClassWithMemAllocations::ClassWithMemAllocations(pCVar3);
    *(ClassWithMemAllocations **)((long)classWithMemAllocationsArr + lVar8) = pCVar3;
    pLVar4 = (LibClass *)operator_new(0x50);
    LibClass::LibClass(pLVar4);
    *(LibClass **)((long)libClassArr + lVar8) = pLVar4;
    pCVar5 = (ComplexClass *)operator_new(0x20);
    ComplexClass::ComplexClass(pCVar5);
    *(ComplexClass **)((long)complexClassArr + lVar8) = pCVar5;
  }
  __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
  if (memLeakCount == 230000) {
    uVar7 = sStack_75348 * 20000 + 0x5747c0;
    if (memLeakSize == uVar7) {
      for (lVar8 = 0; lVar8 != 80000; lVar8 = lVar8 + 8) {
        operator_delete(*(void **)((long)simpleStructArr + lVar8),8);
        operator_delete(*(void **)((long)simpleClassArr + lVar8),8);
        pIVar2 = *(InheritedClass **)((long)inheritedClassArr + lVar8);
        if (pIVar2 != (InheritedClass *)0x0) {
          InheritedClass::~InheritedClass(pIVar2);
        }
        operator_delete(pIVar2,0x10);
        pCVar3 = *(ClassWithMemAllocations **)((long)classWithMemAllocationsArr + lVar8);
        if (pCVar3 != (ClassWithMemAllocations *)0x0) {
          ClassWithMemAllocations::~ClassWithMemAllocations(pCVar3);
        }
        operator_delete(pCVar3,0x18);
        pLVar4 = *(LibClass **)((long)libClassArr + lVar8);
        if (pLVar4 != (LibClass *)0x0) {
          LibClass::~LibClass(pLVar4);
        }
        operator_delete(pLVar4,0x50);
        pCVar5 = *(ComplexClass **)((long)complexClassArr + lVar8);
        if (pCVar5 != (ComplexClass *)0x0) {
          ComplexClass::~ComplexClass(pCVar5);
        }
        operator_delete(pCVar5,0x20);
      }
      __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
      if ((memLeakCount == 0) && (memLeakCount = memLeakSize, memLeakSize == 0)) {
        __stop_and_free_all_mem();
        return;
      }
      uVar6 = 0x87;
      uVar7 = 0;
    }
    else {
      uVar6 = 0x7b;
      memLeakCount = memLeakSize;
    }
  }
  else {
    uVar6 = 0x7b;
    uVar7 = 230000;
  }
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
         "AllocateAllAndThenRelease",uVar6,memLeakCount,uVar7);
  *result = false;
  return;
}

Assistant:

TEST_CASE(AllocateAllAndThenRelease) {

    START_TEST;

    size_t sizeOfSimpleStruct = sizeof(SimpleStruct);
    size_t sizeOfSimpleClass = sizeof(SimpleClass);
    size_t sizeOfInheritedClass = sizeof(InheritedClass) + sizeof(int);
    size_t sizeOfClassWithMemAllocations = sizeof(ClassWithMemAllocations) + sizeof(int) + 12*sizeof(char) + 20*sizeof(float);
    size_t sizeOfLibClass = sizeof(LibClass) + sizeof(double) + LibClass::getSizeOfInternalClass();
    size_t sizeOfComplexClass = sizeof(ComplexClass) + 10*sizeOfSimpleStruct + sizeOfSimpleClass + sizeOfClassWithMemAllocations + sizeOfLibClass;

    SimpleStruct* simpleStructArr[NUM_OF_OBJECTS];
    SimpleClass* simpleClassArr[NUM_OF_OBJECTS];
    InheritedClass* inheritedClassArr[NUM_OF_OBJECTS];
    ClassWithMemAllocations* classWithMemAllocationsArr[NUM_OF_OBJECTS];
    LibClass* libClassArr[NUM_OF_OBJECTS];
    ComplexClass* complexClassArr[NUM_OF_OBJECTS];

    for (int i=0; i < NUM_OF_OBJECTS; i++) {
        simpleStructArr[i] = new SimpleStruct();
        simpleClassArr[i] = new SimpleClass();
        inheritedClassArr[i] = new InheritedClass();
        classWithMemAllocationsArr[i] = new ClassWithMemAllocations();
        libClassArr[i] = new LibClass();
        complexClassArr[i] = new ComplexClass();
    }

    #if !defined _MSC_VER || !defined _DEBUG
    CHECK_MEM_LEAK(NUM_OF_OBJECTS*23, NUM_OF_OBJECTS*(
        sizeOfSimpleStruct + 
        sizeOfSimpleClass + 
        sizeOfInheritedClass + 
        sizeOfClassWithMemAllocations +
        sizeOfLibClass +
        sizeOfComplexClass));
    #endif

    for (int i=0; i < NUM_OF_OBJECTS; i++) {
        delete simpleStructArr[i];
        delete simpleClassArr[i];
        delete inheritedClassArr[i];
        delete classWithMemAllocationsArr[i];
        delete libClassArr[i];
        delete complexClassArr[i];
    }

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}